

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_archive.cpp
# Opt level: O3

bool __thiscall ON_BinaryArchive::ReadObjectUserData(ON_BinaryArchive *this,ON_Object *object)

{
  ON_UUID *uuid;
  _func_int **pp_Var1;
  byte bVar2;
  ON_UUID uuid_00;
  ON_UUID uuid_01;
  ON_UUID item_id;
  ON_UUID application_id;
  byte bVar3;
  bool bVar4;
  bool bVar5;
  int iVar6;
  size_t sVar7;
  ON_ClassId *this_00;
  ON_Object *p;
  ON_UserData *this_01;
  ON_UUID *pOVar8;
  ON_UnknownUserData *pOVar9;
  long lVar10;
  char *sFormat;
  byte bVar11;
  ON_Xform *pOVar12;
  ON_Xform *pOVar13;
  byte bVar14;
  bool bChunkReadSuccess;
  ON__UINT32 t;
  ON__INT64 length_TCODE_ANONYMOUS_CHUNK;
  CUserDataHeaderInfo ud_header;
  ON_ReadChunkHelper ch;
  uchar in_stack_fffffffffffffec8 [8];
  bool local_12d;
  uint local_12c;
  ON__UINT64 local_128;
  ON_Object *local_120;
  CUserDataHeaderInfo local_118;
  ON_ReadChunkHelper local_58;
  
  bVar14 = 0;
  local_12d = true;
  bVar11 = 1;
  local_120 = object;
  do {
    ON_ReadChunkHelper::ON_ReadChunkHelper(&local_58,this,&local_12d);
    if (local_12d != true) {
LAB_0039b59f:
      bVar11 = 0;
LAB_0039b5a5:
      ON_ReadChunkHelper::~ON_ReadChunkHelper(&local_58);
      goto LAB_0039b68c;
    }
    if (local_58.m_chunk_tcode == 0x27ffd) {
      if (local_58.m_chunk_value < (long)((ulong)(0x31 < this->m_3dm_version) * 0x10 + 0x18)) {
        ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_archive.cpp"
                   ,0x15b3,"","TCODE_OPENNURBS_CLASS_USERDATA chunk is too short");
        goto LAB_0039b160;
      }
      local_118.m_classid.Data1._0_1_ = 0;
      sVar7 = Read(this,1,&local_118);
      bVar3 = (byte)local_118.m_classid.Data1;
      if (sVar7 != 1) {
        ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_archive.cpp"
                   ,0x15bd,"","Unable to read TCODE_OPENNURBS_CLASS_USERDATA chunk version numbers")
        ;
LAB_0039b67d:
        ON_ReadChunkHelper::~ON_ReadChunkHelper(&local_58);
        bVar11 = 0;
        goto LAB_0039b68c;
      }
      bVar2 = (byte)local_118.m_classid.Data1 >> 4;
      if (bVar2 - 3 < 0xfffffffe) goto LAB_0039b160;
      CUserDataHeaderInfo::CUserDataHeaderInfo(&local_118);
      local_12c = 0;
      local_128 = 0;
      memset(&local_118,0,0xc0);
      if (bVar2 == 2) {
        bVar4 = BeginRead3dmBigChunk(this,&local_12c,(ON__INT64 *)&local_128);
        if (bVar4) {
          if (local_12c == 0x2fff9) goto LAB_0039b1df;
          ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_archive.cpp"
                     ,0x1544,"",
                     "version 2.0 TCODE_OPENNURBS_CLASS_USERDATA chunk is missing TCODE_OPENNURBS_CLASS_USERDATA_HEADER chunk."
                    );
          EndRead3dmChunk(this,false);
        }
LAB_0039b65c:
        ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_archive.cpp"
                   ,0x15cb,"","Unable to read user data header information.");
        goto LAB_0039b67d;
      }
LAB_0039b1df:
      bVar4 = ReadUuid(this,&local_118.m_classid);
      if (((bVar4) && (bVar4 = ReadUuid(this,&local_118.m_itemid), bVar4)) &&
         (bVar4 = ReadInt32(this,1,&local_118.m_copycount), bVar4)) {
        bVar4 = ReadDouble(this,0x10,(double *)&local_118.m_xform);
      }
      else {
        bVar4 = false;
      }
      if (bVar2 == 2) {
        if ((bVar3 & 0xf) != 0) {
          if (bVar4 == false) {
            bVar4 = false;
          }
          else {
            bVar4 = ReadUuid(this,&local_118.m_appid);
          }
          if ((bVar3 & 0xf) != 1) {
            if (bVar4 != false) {
              bVar4 = ReadBool(this,&local_118.m_bLastSavedAsGoo);
            }
            if (bVar4 != false) {
              bVar4 = ReadInt32(this,1,&local_118.m_3dm_version);
            }
            if (bVar4 != false) {
              bVar4 = ReadInt32(this,1,&local_118.m_3dm_opennurbs_version_number);
            }
          }
        }
        bVar5 = EndRead3dmChunk(this,false);
        bVar4 = (bool)(bVar5 & bVar4);
      }
      if (bVar4 == false) {
        ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_archive.cpp"
                   ,0x1562,"","Unable to read user data header information.");
        goto LAB_0039b65c;
      }
      if ((local_118.m_3dm_version == 0) || (local_118.m_3dm_opennurbs_version_number == 0)) {
        local_118.m_3dm_version = this->m_3dm_version;
        if (0x31 < local_118.m_3dm_version) {
          local_118.m_bLastSavedAsGoo = true;
          local_118.m_3dm_version = 5;
        }
        local_118.m_3dm_opennurbs_version_number = this->m_3dm_opennurbs_version;
        if (0xbf9a56d < local_118.m_3dm_opennurbs_version_number) {
          local_118.m_3dm_opennurbs_version_number = 0xbf9a564;
          local_118.m_bLastSavedAsGoo = true;
        }
      }
      local_128 = 0;
      local_12c = 0;
      bVar4 = PeekAt3dmBigChunkType(this,&local_12c,(ON__INT64 *)&local_128);
      if (!bVar4) goto LAB_0039b67d;
      if (local_12c != 0x40008000) {
        iVar6 = 0x15d9;
        sFormat = "Reading object user data - unable to find TCODE_ANONYMOUS_CHUNK";
LAB_0039b61a:
        ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_archive.cpp"
                   ,iVar6,"",sFormat);
        goto LAB_0039b67d;
      }
      if ((long)local_128 < 4) {
        iVar6 = 0x15df;
        sFormat = "Reading object user data - length of TCODE_ANONYMOUS_CHUNK < 4";
        goto LAB_0039b61a;
      }
      application_id.Data4[0] = local_118.m_appid.Data4[0];
      application_id.Data4[1] = local_118.m_appid.Data4[1];
      application_id.Data4[2] = local_118.m_appid.Data4[2];
      application_id.Data4[3] = local_118.m_appid.Data4[3];
      application_id.Data4[4] = local_118.m_appid.Data4[4];
      application_id.Data4[5] = local_118.m_appid.Data4[5];
      application_id.Data4[6] = local_118.m_appid.Data4[6];
      application_id.Data4[7] = local_118.m_appid.Data4[7];
      application_id.Data1 = local_118.m_appid.Data1;
      application_id.Data2 = local_118.m_appid.Data2;
      application_id.Data3 = local_118.m_appid.Data3;
      item_id.Data4[0] = local_118.m_itemid.Data4[0];
      item_id.Data4[1] = local_118.m_itemid.Data4[1];
      item_id.Data4[2] = local_118.m_itemid.Data4[2];
      item_id.Data4[3] = local_118.m_itemid.Data4[3];
      item_id.Data4[4] = local_118.m_itemid.Data4[4];
      item_id.Data4[5] = local_118.m_itemid.Data4[5];
      item_id.Data4[6] = local_118.m_itemid.Data4[6];
      item_id.Data4[7] = local_118.m_itemid.Data4[7];
      item_id.Data1 = local_118.m_itemid.Data1;
      item_id.Data2 = local_118.m_itemid.Data2;
      item_id.Data3 = local_118.m_itemid.Data3;
      bVar4 = ShouldSerializeUserDataItem(this,application_id,item_id);
      if (bVar4) {
        uuid_00.Data4[0] = in_stack_fffffffffffffec8[0];
        uuid_00.Data4[1] = in_stack_fffffffffffffec8[1];
        uuid_00.Data4[2] = in_stack_fffffffffffffec8[2];
        uuid_00.Data4[3] = in_stack_fffffffffffffec8[3];
        uuid_00.Data4[4] = in_stack_fffffffffffffec8[4];
        uuid_00.Data4[5] = in_stack_fffffffffffffec8[5];
        uuid_00.Data4[6] = in_stack_fffffffffffffec8[6];
        uuid_00.Data4[7] = in_stack_fffffffffffffec8[7];
        uuid_00.Data1 = 0x39b376;
        uuid_00.Data2 = 0;
        uuid_00.Data3 = 0;
        this_00 = ON_ClassId::ClassId(uuid_00);
        if (this_00 == (ON_ClassId *)0x0) {
          bVar4 = ON_UuidIsNil(&local_118.m_appid);
          if ((bVar4) ||
             (iVar6 = (*this->_vptr_ON_BinaryArchive[9])
                                (this,local_118.m_appid._0_8_,local_118.m_appid.Data4), iVar6 != 1))
          {
            this_00 = (ON_ClassId *)0x0;
          }
          else {
            uuid_01.Data4[0] = in_stack_fffffffffffffec8[0];
            uuid_01.Data4[1] = in_stack_fffffffffffffec8[1];
            uuid_01.Data4[2] = in_stack_fffffffffffffec8[2];
            uuid_01.Data4[3] = in_stack_fffffffffffffec8[3];
            uuid_01.Data4[4] = in_stack_fffffffffffffec8[4];
            uuid_01.Data4[5] = in_stack_fffffffffffffec8[5];
            uuid_01.Data4[6] = in_stack_fffffffffffffec8[6];
            uuid_01.Data4[7] = in_stack_fffffffffffffec8[7];
            uuid_01.Data1 = 0x39b3b0;
            uuid_01.Data2 = 0;
            uuid_01.Data3 = 0;
            this_00 = ON_ClassId::ClassId(uuid_01);
          }
          if (this_00 == (ON_ClassId *)0x0) {
            this_00 = &ON_UnknownUserData::m_ON_UnknownUserData_class_rtti;
          }
        }
        p = ON_ClassId::Create(this_00);
        this_01 = ON_UserData::Cast(p);
        if (this_01 == (ON_UserData *)0x0) {
          ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_archive.cpp"
                     ,0x1610,"","Reading object user data - unable to create userdata class");
          if (p != (ON_Object *)0x0) {
            (*p->_vptr_ON_Object[4])(p);
          }
          ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_archive.cpp"
                     ,0x1620,"",
                     "Unable to create object user data class. Flawed class id information.");
        }
        else {
          uuid = &this_01->m_application_uuid;
          bVar4 = ON_UuidIsNil(uuid);
          if (bVar4) {
            bVar4 = ON_UuidIsNil(&local_118.m_appid);
            if (bVar4) {
              iVar6 = this->m_3dm_version;
              if (iVar6 == 4) {
                if (0xbf9a185 < this->m_3dm_opennurbs_version) goto LAB_0039b4a9;
                pOVar8 = &ON_v4_userdata_id;
              }
              else if (iVar6 == 3) {
                pOVar8 = &ON_v3_userdata_id;
              }
              else {
                if (iVar6 != 2) goto LAB_0039b4a9;
                pOVar8 = &ON_v2_userdata_id;
              }
              local_118.m_appid.Data1 = pOVar8->Data1;
              local_118.m_appid.Data2 = pOVar8->Data2;
              local_118.m_appid.Data3 = pOVar8->Data3;
              local_118.m_appid.Data4 = *&pOVar8->Data4;
            }
LAB_0039b4a9:
            uuid->Data1 = local_118.m_appid.Data1;
            uuid->Data2 = local_118.m_appid.Data2;
            uuid->Data3 = local_118.m_appid.Data3;
            *&(this_01->m_application_uuid).Data4 = local_118.m_appid.Data4;
          }
          (this_01->m_userdata_uuid).Data1 = local_118.m_itemid.Data1;
          (this_01->m_userdata_uuid).Data2 = local_118.m_itemid.Data2;
          (this_01->m_userdata_uuid).Data3 = local_118.m_itemid.Data3;
          *&(this_01->m_userdata_uuid).Data4 = local_118.m_itemid.Data4;
          this_01->m_userdata_copycount = local_118.m_copycount;
          pOVar12 = &local_118.m_xform;
          pOVar13 = &this_01->m_userdata_xform;
          for (lVar10 = 0x10; lVar10 != 0; lVar10 = lVar10 + -1) {
            pOVar13->m_xform[0][0] = pOVar12->m_xform[0][0];
            pOVar12 = (ON_Xform *)((long)pOVar12 + ((ulong)bVar14 * -2 + 1) * 8);
            pOVar13 = (ON_Xform *)((long)pOVar13 + (ulong)bVar14 * -0x10 + 8);
          }
          bVar4 = ON_UserData::IsUnknownUserData(this_01);
          if ((bVar4) &&
             (pOVar9 = ON_UnknownUserData::Cast(&this_01->super_ON_Object),
             pOVar9 != (ON_UnknownUserData *)0x0)) {
            pOVar9->m_sizeof_buffer = (int)local_128;
            (pOVar9->m_unknownclass_uuid).Data1 =
                 (int)CONCAT71(local_118.m_classid._1_7_,(byte)local_118.m_classid.Data1);
            (pOVar9->m_unknownclass_uuid).Data2 = local_118.m_classid.Data2;
            (pOVar9->m_unknownclass_uuid).Data3 = local_118.m_classid.Data3;
            *&(pOVar9->m_unknownclass_uuid).Data4 = local_118.m_classid.Data4;
            pOVar9->m_3dm_version = local_118.m_3dm_version;
            pOVar9->m_3dm_opennurbs_version_number = local_118.m_3dm_opennurbs_version_number;
          }
          this_01->m_userdata_owner = local_120;
          bVar4 = ReadObjectUserDataAnonymousChunk
                            (this,local_128,local_118.m_3dm_version,
                             local_118.m_3dm_opennurbs_version_number,this_01);
          this_01->m_userdata_owner = (ON_Object *)0x0;
          pp_Var1 = (this_01->super_ON_Object)._vptr_ON_Object;
          if (bVar4) {
            iVar6 = (*pp_Var1[0x1c])(this_01,this,local_120);
            if (((char)iVar6 != '\0') ||
               (bVar4 = ON_Object::AttachUserData(local_120,this_01), !bVar4)) {
              (*(this_01->super_ON_Object)._vptr_ON_Object[4])(this_01);
            }
          }
          else {
            (*pp_Var1[4])(this_01);
          }
        }
      }
      else {
        local_58.m_bSupressPartiallyReadChunkWarning = true;
      }
      ON_ReadChunkHelper::~ON_ReadChunkHelper(&local_58);
    }
    else {
      if (local_58.m_chunk_tcode == 0x80027fff) {
        bVar11 = 1;
        goto LAB_0039b5a5;
      }
      if (local_58.m_chunk_tcode == 0) goto LAB_0039b59f;
LAB_0039b160:
      ON_ReadChunkHelper::~ON_ReadChunkHelper(&local_58);
    }
    if ((local_12d & 1U) == 0) {
LAB_0039b68c:
      return (bool)(bVar11 & local_12d);
    }
  } while( true );
}

Assistant:

bool ON_BinaryArchive::ReadObjectUserData( ON_Object& object )
{
  bool rc = true;
  bool bChunkReadSuccess = true;
  while(rc && bChunkReadSuccess) 
  {
    // Note:
    //  The destructor ~ON_ReadChunkHelper() may set bChunkReadSuccess
    //  An example of this case occures when reading the corrupt file
    //  attached to bug report RH-22547.
    ON_ReadChunkHelper ch(*this,bChunkReadSuccess);
    if ( !bChunkReadSuccess )
    {
      rc = false;
      break;
    }

    if ( TCODE_OPENNURBS_CLASS_END == ch.m_chunk_tcode )
    {
      // A short TCODE_OPENNURBS_CLASS_END chunk marks the end of the opennurbs class
      break; // done
    }

    if ( TCODE_OPENNURBS_CLASS_USERDATA != ch.m_chunk_tcode )
    {
      if ( 0 == ch.m_chunk_tcode )
      {
        // A short TCODE_OPENNURBS_CLASS_END chunk marks the end of the opennurbs class
        // Checking for zero here fixes RH-22547 which was a report of Rescue3dm taking
        // hours to read a damaged file that was filled with large blocks of zeros 
        // caused by some form of storage media or tranmission corruption.
        rc = false; // there should never be a typecode of zero.
        break;
      }

      // skip new chunk type added by later version
      continue;
    }

    if ( ch.m_chunk_value < (ON__INT64)(8 + 4 * SizeofChunkLength()) )
    {
      ON_ERROR("TCODE_OPENNURBS_CLASS_USERDATA chunk is too short");
      continue;
    }

    // Read userdata header information
    int major_userdata_version = 0;
    int minor_userdata_version = 0;
    rc = Read3dmChunkVersion( &major_userdata_version, &minor_userdata_version );
    if ( !rc )
    {
      ON_ERROR("Unable to read TCODE_OPENNURBS_CLASS_USERDATA chunk version numbers");
      break;
    }

    if ( major_userdata_version < 1 || major_userdata_version > 2 )
    {
      // unsupported version - too old or added in new version
      continue;
    }

    CUserDataHeaderInfo ud_header;
    rc = ReadObjectUserDataHeaderHelper(*this,major_userdata_version,minor_userdata_version,ud_header);
    if (!rc)
    {
      ON_ERROR("Unable to read user data header information.");
      break;
    }

    // we should be ready to read a TCODE_ANONYMOUS_CHUNK containing userdata
    ON__INT64 length_TCODE_ANONYMOUS_CHUNK = 0;
    for(;;)
    {
      ON__UINT32 t = 0;
      rc = PeekAt3dmBigChunkType( &t, &length_TCODE_ANONYMOUS_CHUNK );
      if (!rc)
        break;
      if ( t != TCODE_ANONYMOUS_CHUNK )
      {
        ON_ERROR("Reading object user data - unable to find TCODE_ANONYMOUS_CHUNK");
        rc = false;
        break;
      }
      if ( length_TCODE_ANONYMOUS_CHUNK < 4 )
      {
        ON_ERROR("Reading object user data - length of TCODE_ANONYMOUS_CHUNK < 4");
        rc = false;
        break;
      }
      break;
    }
    if (!rc)
    {
      break;
    }

    if (false == ShouldSerializeUserDataItem(ud_header.m_appid, ud_header.m_itemid))
    {
      ch.m_bSupressPartiallyReadChunkWarning = true;
      continue;
    }

    // attempt to get an instance of the userdata class that saved this information
    ON_UserData* ud = 0;
    for(;;)
    {
      const ON_ClassId* udId = ON_ClassId::ClassId( ud_header.m_classid );
      if ( 0 == udId ) 
      {
        // The application that created this userdata is not active
        if ( !ON_UuidIsNil(ud_header.m_appid) )
        {
          // see if we can load the application
          if ( 1 == LoadUserDataApplication(ud_header.m_appid) )
          {
            // try again
            udId = ON_ClassId::ClassId( ud_header.m_classid );
          }
        }

        if ( 0 == udId )
        {
          // The application that created this user data is
          // not available.  This information will be stored
          // in an ON_UnknownUserData class so that it can
          // persist.
          udId = &ON_CLASS_RTTI(ON_UnknownUserData);
        }
      }

      ON_Object* tmp = udId->Create();
      ud = ON_UserData::Cast(tmp);
      if ( 0 == ud )
      {
        ON_ERROR("Reading object user data - unable to create userdata class");
        if ( tmp )
          delete tmp;
        tmp = 0;
        break;
      }
      tmp = 0;

      break;
    }

    if ( 0 == ud )
    {
      // no luck on this one 
      // One reason can be that the plug-in userdata class has something wrong with 
      // its ON_OBJECT_DECLARE/ON_OBJECT_IMPLEMENT stuff.
      ON_ERROR("Unable to create object user data class. Flawed class id information.");
      continue; // keep trying
    }

    if ( ON_UuidIsNil(ud->m_application_uuid) )
    {
      if ( ON_UuidIsNil(ud_header.m_appid) )
      {
        switch( Archive3dmVersion())
        {
        case 2:
          // V2 archives do not contain app ids.
          // This id flags the userdata as being read from a V3 archive.
          ud_header.m_appid = ON_v2_userdata_id;
          break;
        case 3:
          // V3 archives do not contain app ids.
          // This id flags the userdata as being
          // read from a V3 archive.
          ud_header.m_appid = ON_v3_userdata_id;
          break;
        case 4:
          if ( ArchiveOpenNURBSVersion() < 200909190 )
          {
            // V4 archives before version 200909190
            // did not require user data application ids.
            ud_header.m_appid = ON_v4_userdata_id;
          }
          break;
        }
      }
      ud->m_application_uuid = ud_header.m_appid;
    }
    ud->m_userdata_uuid = ud_header.m_itemid;
    ud->m_userdata_copycount = ud_header.m_copycount;
    ud->m_userdata_xform = ud_header.m_xform;
    if ( ud->IsUnknownUserData() ) 
    {
      ON_UnknownUserData* uud = ON_UnknownUserData::Cast(ud);
      if ( uud ) 
      {
        uud->m_sizeof_buffer = (int)length_TCODE_ANONYMOUS_CHUNK;
        uud->m_unknownclass_uuid = ud_header.m_classid;
        uud->m_3dm_version = ud_header.m_3dm_version;
        uud->m_3dm_opennurbs_version_number = ud_header.m_3dm_opennurbs_version_number;
      }
    }
    ud->m_userdata_owner = &object; // so reading code can look at owner
    bool bReadUserData = ReadObjectUserDataAnonymousChunk(
              length_TCODE_ANONYMOUS_CHUNK,
              ud_header.m_3dm_version,
              ud_header.m_3dm_opennurbs_version_number,
              ud
              );
    ud->m_userdata_owner = 0;
    if (bReadUserData)
    {
      if (ud->DeleteAfterRead(*this,&object))
      {
        // obsolete user data
        delete ud;
      }
      else if (!object.AttachUserData(ud))
      {
        // attach failed
        delete ud;
      }
    }
    else
    {
      delete ud;
    }    
  }

  if ( !bChunkReadSuccess )
    rc = false;

  return rc;
}